

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O1

void __thiscall QtMWidgets::Picker::setMaxCount(Picker *this,int max)

{
  PickerPrivate *pPVar1;
  QAbstractItemModel *pQVar2;
  int iVar3;
  QModelIndex local_48;
  char *local_30;
  
  if (max < 0) {
    local_48.r = 2;
    local_48._4_8_ = 0;
    local_48._12_8_ = 0;
    local_48.m._4_4_ = 0;
    local_30 = "default";
    QMessageLogger::warning
              ((char *)&local_48,"QtMWidgets::Picker::setMaxCount: Invalid count (%d) must be >= 0",
               max);
  }
  else {
    pPVar1 = (this->d).d;
    pQVar2 = pPVar1->model;
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_48,&pPVar1->root);
    iVar3 = (**(code **)(*(long *)pQVar2 + 0x78))(pQVar2,&local_48);
    if (max < iVar3) {
      pPVar1 = (this->d).d;
      pQVar2 = pPVar1->model;
      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_48,&pPVar1->root);
      iVar3 = (**(code **)(*(long *)pQVar2 + 0x78))(pQVar2,&local_48);
      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_48,&((this->d).d)->root);
      (**(code **)(*(long *)pQVar2 + 0x108))(pQVar2,max,iVar3 - max,&local_48);
    }
    ((this->d).d)->maxCount = max;
  }
  return;
}

Assistant:

void
Picker::setMaxCount( int max )
{
	if( max < 0 )
	{
		qWarning( "QtMWidgets::Picker::setMaxCount: Invalid count (%d) must be >= 0",
			max );
		return;
	}

	if( max < count() )
		d->model->removeRows( max, count() - max, d->root );

	d->maxCount = max;
}